

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O2

bool CountHighbitsCollisions<unsigned_long>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *hashes,int nbHBits)

{
  pointer puVar1;
  bool bVar2;
  size_t hnb;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  
  bVar2 = true;
  if (nbHBits < 0x40) {
    uVar5 = (long)(hashes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(hashes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    dVar6 = EstimateNbCollisions((int)uVar5,nbHBits);
    printf("Testing collisions (high %2i-bit) - Expected %12.1f, ",(ulong)(uint)nbHBits);
    puVar1 = (hashes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = 0;
    for (uVar3 = 1; uVar3 < uVar5; uVar3 = uVar3 + 1) {
      uVar4 = uVar4 + (puVar1[uVar3 - 1] >> ((ulong)(0x40 - nbHBits) & 0x3f) ==
                      puVar1[uVar3] >> ((ulong)(0x40 - nbHBits) & 0x3f));
    }
    dVar7 = (double)(int)uVar4 / dVar6;
    printf("actual %6i (%.2fx)",(ulong)uVar4);
    if ((0.98 < dVar7) && (uVar4 - (int)dVar6 != 0)) {
      printf(" (%i)",(ulong)(uVar4 - (int)dVar6));
    }
    if (2.0 < dVar7) {
      puts(" !!!!!");
    }
    else {
      putchar(10);
    }
    bVar2 = 2.0 >= dVar7;
  }
  return bVar2;
}

Assistant:

bool CountHighbitsCollisions ( std::vector<hashtype> & hashes, int nbHBits)
{
  int origBits = sizeof(hashtype) * 8;
  int shiftBy = origBits - nbHBits;

  if (shiftBy <= 0) return true;

  size_t const nbH = hashes.size();
  double expected = EstimateNbCollisions(nbH, nbHBits);
  printf("Testing collisions (high %2i-bit) - Expected %12.1f, ", nbHBits, expected);
  int collcount = 0;

  for (size_t hnb = 1; hnb < nbH; hnb++)
  {
#ifdef DEBUG
    hashtype const h1x = hashes[hnb-1];
    hashtype const h2x = hashes[hnb];
#endif
    hashtype const h1 = hashes[hnb-1] >> shiftBy;
    hashtype const h2 = hashes[hnb]   >> shiftBy;
    if(h1 == h2)
      collcount++;
  }

  printf("actual %6i (%.2fx)", collcount, collcount / expected);
  if (collcount/expected > 0.98 && collcount != (int)expected)
    printf(" (%i)", collcount - (int)expected);

  if(double(collcount) / double(expected) > 2.0)
  {
    printf(" !!!!!\n");
    return false;
  }

  printf("\n");
  return true;
}